

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_sync(rtr_socket *rtr_socket)

{
  int iVar1;
  time_t in_RCX;
  int iVar2;
  rtr_socket_state new_state;
  long in_FS_OFFSET;
  int oldcancelstate;
  char pdu [24065];
  int iStack_1004c;
  undefined1 uStack_10048;
  char cStack_10047;
  ushort uStack_10046;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_setcancelstate(0,&iStack_1004c);
  iVar1 = rtr_receive_pdu(rtr_socket,&uStack_10048,0x3c,in_RCX);
  pthread_setcancelstate(1,&iStack_1004c);
  if (iVar1 != -2) {
    iVar2 = -1;
    do {
      if (iVar1 < 0) goto LAB_00109332;
      if (cStack_10047 != '\0') {
        if (cStack_10047 != '\x03') {
          if (cStack_10047 == '\b') {
            lrtr_dbg("RTR Socket: Cache Reset PDU received");
            new_state = RTR_ERROR_NO_INCR_UPDATE_AVAIL;
            goto LAB_00109328;
          }
          if (cStack_10047 == '\n') {
            rtr_handle_error_pdu(rtr_socket,&uStack_10048);
          }
          else {
            lrtr_dbg("RTR Socket: Expected Cache Response PDU but received PDU Type (Type: %u)");
            rtr_pdu_convert_header_byte_order(local_48,TO_NETWORK_BYTE_ORDER);
            rtr_send_error_pdu(rtr_socket,local_48,8,CORRUPT_DATA,
                               "Unexpected PDU received in data synchronisation",0x30);
          }
          goto LAB_0010932d;
        }
        lrtr_dbg("RTR Socket: Cache Response PDU received");
        if (rtr_socket->request_session_id == true) {
          if (rtr_socket->last_update != 0) {
            lrtr_dbg("RTR Socket: Resetting Socket.");
            rtr_socket->last_update = 0;
            rtr_socket->is_resetting = true;
          }
          rtr_socket->session_id = (uint)uStack_10046;
        }
        else if (rtr_socket->session_id != (uint)uStack_10046) {
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        }
        iVar1 = rtr_sync_receive_and_store_pdus(rtr_socket);
        if (iVar1 == -1) goto LAB_00109332;
        rtr_socket->request_session_id = false;
        iVar1 = lrtr_get_monotonic_time(&rtr_socket->last_update);
        iVar2 = 0;
        if (iVar1 != -1) goto LAB_00109332;
        lrtr_dbg("RTR Socket: get_monotonic_time(..) failed ");
        new_state = RTR_ERROR_FATAL;
        goto LAB_00109328;
      }
      lrtr_dbg("RTR Socket: Ignoring Serial Notify");
      pthread_setcancelstate(0,&iStack_1004c);
      iVar1 = rtr_receive_pdu(rtr_socket,&uStack_10048,0x3c,in_RCX);
      pthread_setcancelstate(1,&iStack_1004c);
    } while (iVar1 != -2);
  }
  new_state = RTR_ERROR_TRANSPORT;
LAB_00109328:
  rtr_change_socket_state(rtr_socket,new_state);
LAB_0010932d:
  iVar2 = -1;
LAB_00109332:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int rtr_sync(struct rtr_socket *rtr_socket)
{
	char pdu[RTR_MAX_PDU_LEN];
	enum pdu_type type;

	int oldcancelstate;

	do {
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
		int rtval = rtr_receive_pdu(rtr_socket, pdu, RTR_MAX_PDU_LEN, RTR_RECV_TIMEOUT);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		// If the cache has closed the connection and we don't have a
		// session_id (no packages where exchanged) we should downgrade.
		if (rtval == TR_CLOSED && rtr_socket->request_session_id) {
			RTR_DBG1("The cache server closed the connection and we have no session_id!");
			if (rtr_socket->version > RTR_PROTOCOL_MIN_SUPPORTED_VERSION) {
				RTR_DBG("Downgrading from %i to version %i", rtr_socket->version,
					rtr_socket->version - 1);
				rtr_socket->version = rtr_socket->version - 1;
				rtr_change_socket_state(rtr_socket, RTR_FAST_RECONNECT);
				return RTR_ERROR;
			}
		}

		if (rtval == TR_WOULDBLOCK) {
			rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
			return RTR_ERROR;
		} else if (rtval < 0) {
			return RTR_ERROR;
		}

		type = rtr_get_pdu_type(pdu);
		if (type == SERIAL_NOTIFY)
			RTR_DBG1("Ignoring Serial Notify");

	} while (type == SERIAL_NOTIFY);

	switch (type) {
	case ERROR:
		rtr_handle_error_pdu(rtr_socket, pdu);
		return RTR_ERROR;
	case CACHE_RESET:
		RTR_DBG1("Cache Reset PDU received");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_NO_INCR_UPDATE_AVAIL);
		return RTR_ERROR;
	case CACHE_RESPONSE:
		rtr_handle_cache_response_pdu(rtr_socket, pdu);
		break;
	default:
		RTR_DBG("Expected Cache Response PDU but received PDU Type (Type: %u)",
			((struct pdu_header *)pdu)->type);
		const char txt[] = "Unexpected PDU received in data synchronisation";

		rtr_send_error_pdu_from_host(rtr_socket, pdu, sizeof(struct pdu_header), CORRUPT_DATA, txt,
					     sizeof(txt));
		return RTR_ERROR;
	}

	// Receive all PDUs until EOD PDU
	if (rtr_sync_receive_and_store_pdus(rtr_socket) == RTR_ERROR)
		return RTR_ERROR;

	rtr_socket->request_session_id = false;
	if (rtr_set_last_update(rtr_socket) == RTR_ERROR)
		return RTR_ERROR;

	return RTR_SUCCESS;
}